

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O2

int Abc_ZddThresh(Abc_ZddMan *p,int a,int b)

{
  Abc_ZddObj *pAVar1;
  int iVar2;
  int True;
  
  iVar2 = a;
  if (1 < a) {
    if (b == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = Abc_ZddCacheLookup(p,a,b,9);
      if (iVar2 < 0) {
        pAVar1 = p->pObjs;
        iVar2 = Abc_ZddThresh(p,pAVar1[(uint)a].False,b);
        True = Abc_ZddThresh(p,pAVar1[(uint)a].True,b + -1);
        iVar2 = Abc_ZddUniqueCreate(p,*(uint *)(pAVar1 + (uint)a) & 0x7fffffff,True,iVar2);
        Abc_ZddCacheInsert(p,a,b,9,iVar2);
      }
    }
  }
  return iVar2;
}

Assistant:

int Abc_ZddThresh( Abc_ZddMan * p, int a, int b )
{
    Abc_ZddObj * A; 
    int r0, r1, r;
    if ( a < 2 )  return a;
    if ( b == 0 ) return 0;
    if ( (r = Abc_ZddCacheLookup(p, a, b, ABC_ZDD_OPER_THRESH)) >= 0 )
        return r;
    A  = Abc_ZddNode( p, a );
    r0 = Abc_ZddThresh( p, A->False, b ),
    r1 = Abc_ZddThresh( p, A->True, b-1 );
    r  = Abc_ZddUniqueCreate( p, A->Var, r1, r0 );
    return Abc_ZddCacheInsert( p, a, b, ABC_ZDD_OPER_THRESH, r );
}